

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,do_statement *s)

{
  bool bVar1;
  statement *s_00;
  expression *e;
  value local_e8;
  value local_c0;
  undefined4 local_94;
  completion local_90;
  undefined1 local_39;
  undefined1 local_38 [8];
  label_set ls;
  do_statement *s_local;
  impl *this_local;
  completion *c;
  
  ls.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)s;
  get_labels((label_set *)local_38,this,&s->super_statement);
  local_39 = 0;
  completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
  do {
    s_00 = do_statement::s((do_statement *)
                           ls.
                           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eval(&local_90,this,s_00);
    completion::operator=(__return_storage_ptr__,&local_90);
    completion::~completion(&local_90);
    bVar1 = handle_completion(__return_storage_ptr__,(label_set *)local_38);
    if (bVar1) goto LAB_0013296d;
    e = do_statement::cond((do_statement *)
                           ls.
                           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    eval(&local_e8,this,e);
    get_value(&local_c0,this,&local_e8);
    bVar1 = to_boolean(&local_c0);
    value::~value(&local_c0);
    value::~value(&local_e8);
  } while (bVar1);
  bVar1 = completion::operator_cast_to_bool(__return_storage_ptr__);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!c",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x3aa,"completion mjs::interpreter::impl::operator()(const do_statement &)");
  }
LAB_0013296d:
  local_39 = 1;
  local_94 = 1;
  std::
  vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::~vector((vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const do_statement& s) {
        const auto ls = get_labels(s);
        completion c{};
        do {
            c = eval(s.s());
            if (handle_completion(c, ls)) {
                return c;
            }
        } while (to_boolean(get_value(eval(s.cond()))));
        assert(!c);
        return c;//completion{c.result};
    }